

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2raster.cpp
# Opt level: O3

Texture * rw::ps2::readNativeTexture(Stream *stream)

{
  undefined8 *puVar1;
  bool bVar2;
  byte bVar3;
  uint32 uVar4;
  Texture *this;
  Raster *raster;
  uint filter;
  uint8 *puVar5;
  long lVar6;
  uint32 length;
  uint32 version;
  uint64 tex1;
  uint local_80;
  uint32 local_7c;
  uint64 local_78;
  int32 local_70;
  int32 local_6c;
  int32 local_68;
  ushort local_64;
  short local_62;
  ulong local_60;
  undefined4 local_58;
  undefined1 local_54;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined4 local_38;
  undefined2 local_34;
  
  bVar2 = findChunk(stream,1,(uint32 *)0x0,(uint32 *)0x0);
  if (!bVar2) {
    readNativeTexture();
    return (Texture *)0x0;
  }
  uVar4 = Stream::readU32(stream);
  if (uVar4 != 0x325350) {
    readNativeTexture((ps2 *)(ulong)uVar4);
    return (Texture *)0x0;
  }
  this = Texture::create((Raster *)0x0);
  if (this == (Texture *)0x0) {
    return (Texture *)0x0;
  }
  uVar4 = Stream::readU32(stream);
  this->filterAddressing = uVar4;
  bVar2 = findChunk(stream,2,&local_80,(uint32 *)0x0);
  if (!bVar2) {
    readNativeTexture();
    goto LAB_0012c1a4;
  }
  (*stream->_vptr_Stream[4])(stream,this->name,(ulong)local_80);
  bVar2 = findChunk(stream,2,&local_80,(uint32 *)0x0);
  if (!bVar2) {
    readNativeTexture();
    goto LAB_0012c1a4;
  }
  (*stream->_vptr_Stream[4])(stream,this->mask,(ulong)local_80);
  uVar4 = rw::version;
  bVar2 = findChunk(stream,1,(uint32 *)0x0,(uint32 *)0x0);
  if (!bVar2) {
    readNativeTexture();
    goto LAB_0012c1a4;
  }
  bVar2 = findChunk(stream,1,(uint32 *)0x0,&local_7c);
  if (!bVar2) {
    readNativeTexture();
    goto LAB_0012c1a4;
  }
  (*stream->_vptr_Stream[4])(stream,&local_70,0x40);
  noNewStyleRasters = (uint)(local_62 < 2);
  rw::version = local_7c;
  raster = Raster::create(local_70,local_6c,local_68,(uint)local_64,4);
  noNewStyleRasters = 0;
  rw::version = uVar4;
  this->raster = raster;
  lVar6 = (long)nativeRasterOffset;
  filter = this->filterAddressing & 0xf;
  calcTEX1(raster,&local_78,filter);
  local_60 = local_60 & 0xfff8001fffffc000;
  *(ulong *)((long)&raster->platform + lVar6) = local_60;
  *(undefined4 *)((long)&raster->flags + lVar6) = local_58;
  *(undefined1 *)((long)&raster->privateFlags + lVar6 + 2) = local_54;
  puVar1 = (undefined8 *)((long)&raster->format + lVar6);
  *puVar1 = local_50;
  puVar1[1] = uStack_48;
  *(undefined8 *)((long)&raster->stride + lVar6) = local_40;
  *(undefined4 *)((long)&raster->pixels + lVar6) = local_38;
  *(undefined2 *)((long)&raster->privateFlags + lVar6) = local_34;
  calcTEX1(raster,&local_78,filter);
  if (local_62 < 2) {
    bVar3 = *(byte *)((long)&raster->pixels + lVar6 + 4);
    if (local_62 == 1) {
      if ((bVar3 & 1) == 0) {
        bVar3 = bVar3 | 2;
LAB_0012c114:
        *(byte *)((long)&raster->pixels + lVar6 + 4) = bVar3;
      }
    }
    else if ((bVar3 & 1) == 0) {
      bVar3 = bVar3 & 0xfc;
      goto LAB_0012c114;
    }
  }
  bVar2 = findChunk(stream,1,&local_80,(uint32 *)0x0);
  if (bVar2) {
    if (local_62 < 2) {
      puVar5 = raster->pixels;
    }
    else {
      (*stream->_vptr_Stream[4])
                (stream,*(undefined8 *)raster->originalPixels,
                 (ulong)*(uint *)((long)&raster->stride + lVar6));
      puVar5 = raster->palette + -0x50;
      local_80 = *(uint *)(&raster->field_0x24 + lVar6);
    }
    (*stream->_vptr_Stream[4])(stream,puVar5,(ulong)local_80);
    return this;
  }
  readNativeTexture();
LAB_0012c1a4:
  Texture::destroy(this);
  return (Texture *)0x0;
}

Assistant:

Texture*
readNativeTexture(Stream *stream)
{
	uint32 length, oldversion, version;
	uint32 fourcc;
	Raster *raster;
	Ps2Raster *natras;
	if(!findChunk(stream, ID_STRUCT, nil, nil)){
		RWERROR((ERR_CHUNK, "STRUCT"));
		return nil;
	}
	fourcc = stream->readU32();
	if(fourcc != FOURCC_PS2){
		RWERROR((ERR_PLATFORM, fourcc));
		return nil;
	}
	Texture *tex = Texture::create(nil);
	if(tex == nil)
		return nil;

	// Texture
	tex->filterAddressing = stream->readU32();
	if(!findChunk(stream, ID_STRING, &length, nil)){
		RWERROR((ERR_CHUNK, "STRING"));
		goto fail;
	}
	stream->read8(tex->name, length);
	if(!findChunk(stream, ID_STRING, &length, nil)){
		RWERROR((ERR_CHUNK, "STRING"));
		goto fail;
	}
	stream->read8(tex->mask, length);

	// Raster
	StreamRasterExt streamExt;
	oldversion = rw::version;
	if(!findChunk(stream, ID_STRUCT, nil, nil)){
		RWERROR((ERR_CHUNK, "STRUCT"));
		goto fail;
	}
	if(!findChunk(stream, ID_STRUCT, nil, &version)){
		RWERROR((ERR_CHUNK, "STRUCT"));
		goto fail;
	}
	ASSERTLITTLE;
	stream->read8(&streamExt, 0x40);
/*
printf("%X %X %X %X %X %016llX %X %X %016llX %016llX %X %X %X %X\n",
streamExt.width,
streamExt.height,
streamExt.depth,
streamExt.rasterFormat,
streamExt.version,
streamExt.tex0,
streamExt.paletteOffset,
streamExt.tex1low,
streamExt.miptbp1,
streamExt.miptbp2,
streamExt.pixelSize,
streamExt.paletteSize,
streamExt.totalSize,
streamExt.mipmapVal);
*/
	noNewStyleRasters = streamExt.version < 2;
	rw::version = version;
	raster = Raster::create(streamExt.width, streamExt.height,
	                        streamExt.depth, streamExt.rasterFormat,
	                        PLATFORM_PS2);
	noNewStyleRasters = 0;
	rw::version = oldversion;
	tex->raster = raster;
	natras = GETPS2RASTEREXT(raster);
//printf("%X %X\n", natras->paletteBase, natras->tex1low);
//	printf("%08X%08X %08X%08X %08X%08X\n",
//	       (uint32)natras->tex0, (uint32)(natras->tex0>>32),
//	       (uint32)natras->miptbp1, (uint32)(natras->miptbp1>>32),
//	       (uint32)natras->miptbp2, (uint32)(natras->miptbp2>>32));
//	printTEX0(natras->tex0);
	uint64 tex1;
	calcTEX1(raster, &tex1, tex->filterAddressing & 0xF);
//	printTEX1(tex1);

	// TODO: GTA SA LD_OTB.txd loses here
	assert(natras->pixelSize >= streamExt.pixelSize);
	assert(natras->paletteSize >= streamExt.paletteSize);

//if(natras->tex0 != streamExt.tex0){
//printf("TEX0: %016llX\n      %016llX\n", natras->tex0, streamExt.tex0);
//printTEX0(natras->tex0);
//printTEX0(streamExt.tex0);
//fflush(stdout);
//}
//if(natras->tex1low != streamExt.tex1low)
//printf("TEX1: %08X\n      %08X\n", natras->tex1low, streamExt.tex1low);
//if(natras->miptbp1 != streamExt.miptbp1)
//printf("MIP1: %016llX\n      %016llX\n", natras->miptbp1, streamExt.miptbp1);
//if(natras->miptbp2 != streamExt.miptbp2)
//printf("MIP2: %016llX\n      %016llX\n", natras->miptbp2, streamExt.miptbp2);
//if(natras->paletteBase != streamExt.paletteOffset)
//printf("PAL: %08X\n     %08X\n", natras->paletteBase, streamExt.paletteOffset);
//if(natras->pixelSize != streamExt.pixelSize)
//printf("PXS: %08X\n     %08X\n", natras->pixelSize, streamExt.pixelSize);
//if(natras->paletteSize != streamExt.paletteSize)
//printf("PLS: %08X\n     %08X\n", natras->paletteSize, streamExt.paletteSize);
//if(natras->totalSize != streamExt.totalSize)
//printf("TSZ: %08X\n     %08X\n", natras->totalSize, streamExt.totalSize);

	// junk addresses, no need to store them
	streamExt.tex0 &= ~0x3FFFULL;
	streamExt.tex0 &= ~(0x3FFFULL << 37);

	assert(natras->tex0 == streamExt.tex0);
	natras->tex0 = streamExt.tex0;
	assert(natras->paletteBase == streamExt.paletteOffset);
	natras->paletteBase = streamExt.paletteOffset;
	assert(natras->tex1low == streamExt.tex1low);
	natras->tex1low = streamExt.tex1low;
	assert(natras->miptbp1 == streamExt.miptbp1);
	natras->miptbp1 = streamExt.miptbp1;
	assert(natras->miptbp2 == streamExt.miptbp2);
	natras->miptbp2 = streamExt.miptbp2;
	assert(natras->pixelSize == streamExt.pixelSize);
	natras->pixelSize = streamExt.pixelSize;
	assert(natras->paletteSize == streamExt.paletteSize);
	natras->paletteSize = streamExt.paletteSize;
	assert(natras->totalSize == streamExt.totalSize);
	natras->totalSize = streamExt.totalSize;
	natras->kl = streamExt.mipmapVal;
//printf("%X %X\n", natras->paletteBase, natras->tex1low);
//	printf("%08X%08X %08X%08X %08X%08X\n",
//	       (uint32)natras->tex0, (uint32)(natras->tex0>>32),
//	       (uint32)natras->miptbp1, (uint32)(natras->miptbp1>>32),
//	       (uint32)natras->miptbp2, (uint32)(natras->miptbp2>>32));
//	printTEX0(natras->tex0);
	calcTEX1(raster, &tex1, tex->filterAddressing & 0xF);
//	printTEX1(tex1);

	// this is weird stuff
	if(streamExt.version < 2){
		if(streamExt.version == 1){
			// Version 1 has swizzled 8 bit textures
			if(!(natras->flags & Ps2Raster::NEWSTYLE))
				natras->flags |= Ps2Raster::SWIZZLED8;
			else
				assert(0 && "can't happen");
		}else{
			// Version 0 has no swizzling at all
			if(!(natras->flags & Ps2Raster::NEWSTYLE))
				natras->flags &= ~Ps2Raster::SWIZZLED8;
			else
				assert(0 && "can't happen");
		}
	}

	if(!findChunk(stream, ID_STRUCT, &length, nil)){
		RWERROR((ERR_CHUNK, "STRUCT"));
		goto fail;
	}
	if(streamExt.version < 2){
		stream->read8(raster->pixels, length);
	}else{
		stream->read8(((Ps2Raster::PixelPtr*)raster->originalPixels)->pixels, natras->pixelSize);
		stream->read8(raster->palette-0x50, natras->paletteSize);
	}
//printf("\n");
	return tex;

fail:
	tex->destroy();
	return nil;
}